

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

int __thiscall DetectorSS::loghash(DetectorSS *this,unsigned_long p)

{
  int ret;
  
  ret = 0;
  for (; (p & 1) != 0; p = p >> 1) {
    ret = ret + 1;
  }
  return ret;
}

Assistant:

int DetectorSS::loghash(unsigned long p) {
	int ret = 0;
	while ((p & 0x00000001) == 1) {
		p >>= 1;
		ret++;
	}
	return ret;
}